

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_expr.hpp
# Opt level: O3

void __thiscall
viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::rt_unary_expr
          (rt_unary_expr<viennamath::rt_expression_interface<double>_> *this,
          rt_unary_expr<viennamath::rt_expression_interface<double>_> *other)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  (this->super_rt_expression_interface<double>)._vptr_rt_expression_interface =
       (_func_int **)&PTR__rt_unary_expr_0012f2e0;
  iVar1 = (*((other->expr_)._M_ptr)->_vptr_rt_expression_interface[2])();
  (this->expr_)._M_ptr = (rt_expression_interface<double> *)CONCAT44(extraout_var,iVar1);
  iVar1 = (*((other->op_)._M_ptr)->_vptr_op_interface[2])();
  (this->op_)._M_ptr =
       (op_interface<viennamath::rt_expression_interface<double>_> *)CONCAT44(extraout_var_00,iVar1)
  ;
  return;
}

Assistant:

rt_unary_expr(rt_unary_expr const & other) : expr_(other.expr_->clone()),
                                             op_(other.op_->clone()) {}